

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::GradX
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,TPZVec<double> *par
          ,TPZFMatrix<double> *gradx)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  TPZFMatrix<double> *in_stack_00001a88;
  TPZVec<double> *in_stack_00001a90;
  TPZFMatrix<double> *in_stack_00001a98;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_00001aa0;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::GradX<double>
            (in_stack_00001aa0,in_stack_00001a98,in_stack_00001a90,in_stack_00001a88);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x16fb591);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<REAL> &par, TPZFMatrix<REAL> &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}